

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.lex.cc
# Opt level: O0

YY_BUFFER_STATE ppyy_create_buffer(FILE *file,int size)

{
  YY_BUFFER_STATE b_00;
  char *pcVar1;
  YY_BUFFER_STATE b;
  int size_local;
  FILE *file_local;
  
  b_00 = (YY_BUFFER_STATE)ppyyalloc(0x40);
  if (b_00 == (YY_BUFFER_STATE)0x0) {
    yy_fatal_error("out of dynamic memory in yy_create_buffer()");
  }
  b_00->yy_buf_size = size;
  pcVar1 = (char *)ppyyalloc((long)(b_00->yy_buf_size + 2));
  b_00->yy_ch_buf = pcVar1;
  if (b_00->yy_ch_buf == (char *)0x0) {
    yy_fatal_error("out of dynamic memory in yy_create_buffer()");
  }
  b_00->yy_is_our_buffer = 1;
  ppyy_init_buffer(b_00,file);
  return b_00;
}

Assistant:

YY_BUFFER_STATE yy_create_buffer  (FILE * file, int  size )
{
	YY_BUFFER_STATE b;
    
	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_buf_size = size;

	/* yy_ch_buf has to be 2 characters longer than the size given because
	 * we need to put in 2 end-of-buffer characters.
	 */
	b->yy_ch_buf = (char *) yyalloc( (yy_size_t) (b->yy_buf_size + 2)  );
	if ( ! b->yy_ch_buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_is_our_buffer = 1;

	yy_init_buffer( b, file );

	return b;
}